

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O3

bool doctest::detail::parseOptionImpl(int argc,char **argv,char *pattern,String *res)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  char *in_RAX;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  EVP_PKEY_CTX *src;
  ulong uVar8;
  String local_38;
  
  if (argc < 1) {
    return false;
  }
  uVar8 = (ulong)(uint)argc;
  local_38.m_str = in_RAX;
  do {
    pcVar6 = argv[uVar8 - 1];
    pcVar4 = strstr(pcVar6,pattern);
    pcVar5 = pcVar6;
    if (pcVar4 != (char *)0x0) {
      do {
        if (pcVar5 == pcVar4) {
          if (*pcVar6 == '-') {
            pcVar6 = pattern + -1;
            pcVar5 = pattern;
            if (pattern == (char *)0x0) {
              pcVar6 = (char *)0x0;
            }
            else {
              do {
                pcVar6 = pcVar6 + 1;
                cVar1 = *pcVar5;
                pcVar5 = pcVar5 + 1;
              } while (cVar1 != '\0');
            }
            lVar7 = -1;
            do {
              lVar3 = lVar7 + 1;
              lVar7 = lVar7 + 1;
            } while ((pcVar4 + ((long)pcVar6 - (long)pattern))[lVar3] != '\0');
            if ((int)lVar7 != 0) {
              String::String(&local_38,pcVar4 + ((long)pcVar6 - (long)pattern));
              String::copy(res,(EVP_PKEY_CTX *)&local_38,src);
              free(local_38.m_str);
              return true;
            }
          }
          break;
        }
        cVar1 = *pcVar5;
        pcVar5 = pcVar5 + 1;
      } while (cVar1 == '-');
    }
    bVar2 = (long)uVar8 < 2;
    uVar8 = uVar8 - 1;
    if (bVar2) {
      return false;
    }
  } while( true );
}

Assistant:

bool parseOptionImpl(int argc, const char* const* argv, const char* pattern, String& res) {
        for(int i = argc - 1; i >= 0; --i) {
            const char* temp = strstr(argv[i], pattern);
            if(temp) {
                // eliminate matches in which the chars before the option are not '-'
                bool        noBadCharsFound = true;
                const char* curr            = argv[i];
                while(curr != temp) {
                    if(*curr++ != '-') {
                        noBadCharsFound = false;
                        break;
                    }
                }
                if(noBadCharsFound && argv[i][0] == '-') {
                    temp += my_strlen(pattern);
                    unsigned len = my_strlen(temp);
                    if(len) {
                        res = temp;
                        return true;
                    }
                }
            }
        }
        return false;
    }